

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staleblock_test.cc
# Opt level: O1

void rollback_with_num_keeping_headers(void)

{
  fdb_status fVar1;
  sb_decision_t sVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  fdb_kvs_handle *pfVar6;
  fdb_kvs_handle *pfVar7;
  fdb_kvs_handle *pfVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  fdb_doc **doc;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  fdb_kvs_handle *pfVar15;
  ulong uVar16;
  char *pcVar17;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_kvs_info kvs_info;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  fdb_file_info file_info;
  char keybuf [256];
  char bodybuf [1024];
  fdb_config fconfig;
  fdb_kvs_handle *pfStackY_1e78;
  fdb_file_handle *pfStackY_1e70;
  fdb_kvs_config fStackY_1e68;
  char acStackY_1e50 [264];
  fdb_config fStackY_1d48;
  char acStackY_1c50 [520];
  fdb_doc **ppfStackY_1a48;
  size_t sStackY_1a38;
  char *pcStackY_1a30;
  char *pcStackY_1a28;
  code *pcStackY_1a20;
  fdb_kvs_handle *pfStack_1a10;
  fdb_file_handle *pfStack_1a08;
  fdb_iterator *pfStack_1a00;
  fdb_doc *pfStack_19f8;
  fdb_kvs_handle *pfStack_19f0;
  timeval tStack_19e8;
  char acStack_19d8 [512];
  fdb_kvs_config fStack_17d8;
  fdb_file_info fStack_17c0;
  char acStack_1778 [256];
  fdb_config fStack_1678;
  char *pcStack_1580;
  fdb_kvs_handle *pfStack_1578;
  fdb_kvs_handle *pfStack_1570;
  fdb_kvs_handle *pfStack_1568;
  fdb_kvs_handle *pfStack_1560;
  fdb_kvs_handle *pfStack_1558;
  fdb_kvs_handle *pfStack_1548;
  fdb_file_handle *pfStack_1540;
  uint uStack_1534;
  fdb_kvs_info fStack_1530;
  timeval tStack_1500;
  fdb_kvs_config fStack_14f0;
  undefined1 auStack_14d8 [80];
  docio_handle *pdStack_1488;
  btreeblk_handle *pbStack_1480;
  btree_blk_ops *pbStack_1478;
  filemgr_ops *pfStack_1470;
  fdb_config fStack_1468;
  undefined1 uStack_1291;
  fdb_kvs_handle fStack_1290;
  fdb_kvs_handle *pfStack_1088;
  char *pcStack_1080;
  char *pcStack_1078;
  fdb_kvs_handle *pfStack_1070;
  fdb_kvs_handle *pfStack_1068;
  fdb_file_handle *pfStack_1060;
  timeval tStack_1058;
  undefined1 auStack_1048 [536];
  undefined1 auStack_e30 [375];
  undefined1 uStack_cb9;
  fdb_kvs_handle *pfStack_c30;
  undefined8 uStack_c18;
  fdb_kvs_handle *pfStack_bf0;
  fdb_kvs_handle *pfStack_be8;
  fdb_kvs_handle *pfStack_be0;
  fdb_kvs_handle *pfStack_bd8;
  fdb_kvs_handle *pfStack_bd0;
  code *pcStack_bc8;
  fdb_kvs_handle *pfStack_bc0;
  fdb_file_handle *pfStack_bb8;
  fdb_kvs_handle *pfStack_bb0;
  fdb_kvs_handle *pfStack_ba8;
  fdb_kvs_config fStack_ba0;
  timeval tStack_b88;
  fdb_file_info fStack_b78;
  fdb_kvs_info fStack_b30;
  undefined1 auStack_b00 [512];
  fdb_kvs_handle fStack_900;
  size_t sStack_6f8;
  char *pcStack_6f0;
  char *pcStack_6e8;
  code *pcStack_6e0;
  fdb_kvs_handle *local_6d8;
  fdb_file_handle *local_6d0;
  fdb_kvs_info local_6c8;
  timeval local_698;
  fdb_kvs_config local_688;
  fdb_file_info local_670;
  char local_628 [256];
  char local_528 [511];
  undefined1 local_329;
  fdb_config local_128;
  
  pcStack_6e0 = (code *)0x10d13a;
  gettimeofday(&local_698,(__timezone_ptr_t)0x0);
  pcStack_6e0 = (code *)0x10d13f;
  memleak_start();
  pcStack_6e0 = (code *)0x10d14c;
  fdb_get_default_kvs_config();
  pcStack_6e0 = (code *)0x10d15c;
  fdb_get_default_config();
  local_128.compaction_threshold = '\0';
  local_128.block_reusing_threshold = 0x41;
  local_128.num_keeping_headers = 1;
  pcStack_6e0 = (code *)0x10d183;
  system("rm -rf  staleblktest* > errorlog.txt");
  pcStack_6e0 = (code *)0x10d19a;
  fdb_open(&local_6d0,"./staleblktest1",&local_128);
  pcStack_6e0 = (code *)0x10d1a8;
  fdb_kvs_open_default(local_6d0,&local_6d8,&local_688);
  pcVar9 = "%dkey";
  pcVar10 = local_628;
  pcVar11 = local_528;
  pcVar17 = (char *)0x0;
  do {
    pcStack_6e0 = (code *)0x10d1d0;
    sprintf(pcVar10,"%dkey",pcVar17);
    pcStack_6e0 = (code *)0x10d1e2;
    memset(pcVar11,0x62,0x1ff);
    pfVar15 = local_6d8;
    local_329 = 0;
    pcStack_6e0 = (code *)0x10d1f6;
    sVar4 = strlen(pcVar10);
    pcStack_6e0 = (code *)0x10d201;
    sVar5 = strlen(pcVar11);
    pcStack_6e0 = (code *)0x10d215;
    fVar1 = fdb_set_kv(pfVar15,pcVar10,sVar4,pcVar11,sVar5);
    if (fVar1 != FDB_RESULT_SUCCESS) {
LAB_0010d465:
      pcStack_6e0 = (code *)0x10d46c;
      rollback_with_num_keeping_headers();
      goto LAB_0010d46c;
    }
    pcStack_6e0 = (code *)0x10d22c;
    fVar1 = fdb_commit(local_6d0,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcStack_6e0 = (code *)0x10d465;
      rollback_with_num_keeping_headers();
      goto LAB_0010d465;
    }
    uVar12 = (int)pcVar17 + 1;
    pcVar17 = (char *)(ulong)uVar12;
  } while (uVar12 != 10);
  pcVar11 = (char *)0x0;
  pcVar17 = local_628;
  pcVar10 = local_528;
  pcVar9 = (char *)0x0;
  do {
    pfVar15 = local_6d8;
    builtin_strncpy(local_628,"0key",5);
    builtin_strncpy(local_528,
                    "ccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccc"
                    ,0x80);
    pcStack_6e0 = (code *)0x10d2be;
    sVar4 = strlen(pcVar17);
    pcStack_6e0 = (code *)0x10d2c9;
    sVar5 = strlen(pcVar10);
    pcStack_6e0 = (code *)0x10d2dd;
    fVar1 = fdb_set_kv(pfVar15,pcVar17,sVar4,pcVar10,sVar5);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010d473;
    pcStack_6e0 = (code *)0x10d2f4;
    fVar1 = fdb_get_file_info(local_6d0,&local_670);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010d46c;
    uVar12 = (int)pcVar9 + 1;
    pcVar9 = (char *)(ulong)uVar12;
  } while (local_670.file_size < 0x1000000);
  pcStack_6e0 = (code *)0x10d319;
  sVar2 = sb_check_block_reusing(local_6d8);
  if (sVar2 != SBD_RECLAIM) goto LAB_0010d481;
  pcStack_6e0 = (code *)0x10d331;
  fVar1 = fdb_commit(local_6d0,'\x01');
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010d486;
  pcVar10 = local_628;
  pcVar11 = local_528;
  pcVar17 = (char *)0x0;
  do {
    pcStack_6e0 = (code *)0x10d35e;
    sprintf(pcVar10,"%dkey",pcVar17);
    pcStack_6e0 = (code *)0x10d370;
    memset(pcVar11,100,0x1ff);
    pfVar15 = local_6d8;
    local_329 = 0;
    pcStack_6e0 = (code *)0x10d384;
    sVar4 = strlen(pcVar10);
    pcStack_6e0 = (code *)0x10d38f;
    sVar5 = strlen(pcVar11);
    pcStack_6e0 = (code *)0x10d3a3;
    fVar1 = fdb_set_kv(pfVar15,pcVar10,sVar4,pcVar11,sVar5);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010d47a;
    uVar13 = (int)pcVar17 + 1;
    pcVar17 = (char *)(ulong)uVar13;
  } while (uVar12 != uVar13);
  pcStack_6e0 = (code *)0x10d3be;
  fVar1 = fdb_rollback(&local_6d8,10);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010d48d;
  pcStack_6e0 = (code *)0x10d3d4;
  fVar1 = fdb_get_kvs_info(local_6d8,&local_6c8);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010d494;
  if (local_6c8.doc_count != 10) {
    pcStack_6e0 = (code *)0x10d3ee;
    rollback_with_num_keeping_headers();
  }
  pcStack_6e0 = (code *)0x10d3f7;
  fVar1 = fdb_kvs_close(local_6d8);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010d49b;
  pcStack_6e0 = (code *)0x10d409;
  fVar1 = fdb_close(local_6d0);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pcStack_6e0 = (code *)0x10d416;
    fdb_shutdown();
    pcStack_6e0 = (code *)0x10d41b;
    memleak_end();
    pcVar17 = "%s PASSED\n";
    if (rollback_with_num_keeping_headers()::__test_pass != '\0') {
      pcVar17 = "%s FAILED\n";
    }
    pcStack_6e0 = (code *)0x10d44c;
    fprintf(_stderr,pcVar17,"rollback with num keeping headers");
    return;
  }
  goto LAB_0010d4a2;
LAB_0010d46c:
  pcStack_6e0 = (code *)0x10d473;
  rollback_with_num_keeping_headers();
LAB_0010d473:
  pcStack_6e0 = (code *)0x10d47a;
  rollback_with_num_keeping_headers();
LAB_0010d47a:
  pcStack_6e0 = (code *)0x10d481;
  rollback_with_num_keeping_headers();
LAB_0010d481:
  pcStack_6e0 = (code *)0x10d486;
  rollback_with_num_keeping_headers();
LAB_0010d486:
  pcStack_6e0 = (code *)0x10d48d;
  rollback_with_num_keeping_headers();
LAB_0010d48d:
  pcStack_6e0 = (code *)0x10d494;
  rollback_with_num_keeping_headers();
LAB_0010d494:
  pcStack_6e0 = (code *)0x10d49b;
  rollback_with_num_keeping_headers();
LAB_0010d49b:
  pcStack_6e0 = (code *)0x10d4a2;
  rollback_with_num_keeping_headers();
LAB_0010d4a2:
  pcStack_6e0 = crash_and_recover_with_num_keeping_test;
  rollback_with_num_keeping_headers();
  pcStack_bc8 = (code *)0x10d4c6;
  fStack_900.bub_ctx.space_used = (uint64_t)pcVar9;
  sStack_6f8 = sVar4;
  pcStack_6f0 = pcVar10;
  pcStack_6e8 = pcVar11;
  pcStack_6e0 = (code *)pcVar17;
  gettimeofday(&tStack_b88,(__timezone_ptr_t)0x0);
  pcStack_bc8 = (code *)0x10d4cb;
  memleak_start();
  pcStack_bc8 = (code *)0x10d4d8;
  fdb_get_default_kvs_config();
  pcStack_bc8 = (code *)0x10d4e8;
  fdb_get_default_config();
  fStack_900.config.block_reusing_threshold._7_1_ = 0;
  fStack_900.max_seqnum = 0x41;
  fStack_900.handle_busy.super___atomic_base<unsigned_char>._M_i = (__atomic_base<unsigned_char>)0xa
  ;
  fStack_900.dirty_updates = '\0';
  fStack_900._466_6_ = 0;
  pcStack_bc8 = (code *)0x10d50f;
  system("rm -rf  staleblktest* > errorlog.txt");
  pcStack_bc8 = (code *)0x10d526;
  fdb_open(&pfStack_bb8,"./staleblktest1file.1",(fdb_config *)&fStack_900.config.encryption_key);
  pcStack_bc8 = (code *)0x10d53b;
  fdb_kvs_open(pfStack_bb8,&pfStack_bc0,"./staleblktest1",&fStack_ba0);
  pcVar10 = "%dkey";
  pfVar15 = &fStack_900;
  pfVar8 = (fdb_kvs_handle *)auStack_b00;
  pcVar17 = (char *)0x0;
  do {
    pcStack_bc8 = (code *)0x10d563;
    sprintf((char *)pfVar15,"%dkey",pcVar17);
    pcStack_bc8 = (code *)0x10d575;
    memset(pfVar8,0x62,0x1ff);
    pfVar7 = pfStack_bc0;
    auStack_b00[0x1ff] = 0;
    pcStack_bc8 = (code *)0x10d589;
    pfVar6 = (fdb_kvs_handle *)strlen((char *)pfVar15);
    pcStack_bc8 = (code *)0x10d594;
    sVar5 = strlen((char *)pfVar8);
    pcStack_bc8 = (code *)0x10d5a8;
    fVar1 = fdb_set_kv(pfVar7,pfVar15,(size_t)pfVar6,pfVar8,sVar5);
    if (fVar1 != FDB_RESULT_SUCCESS) {
LAB_0010da08:
      pcStack_bc8 = (code *)0x10da0f;
      crash_and_recover_with_num_keeping_test();
      goto LAB_0010da0f;
    }
    pcStack_bc8 = (code *)0x10d5bf;
    fVar1 = fdb_commit(pfStack_bb8,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcStack_bc8 = (code *)0x10da08;
      crash_and_recover_with_num_keeping_test();
      goto LAB_0010da08;
    }
    uVar12 = (int)pcVar17 + 1;
    pcVar17 = (char *)(ulong)uVar12;
  } while (uVar12 != 0xb);
  pfVar8 = (fdb_kvs_handle *)0x0;
  pcVar10 = (char *)&fStack_900;
  pcVar17 = auStack_b00;
  pfVar15 = (fdb_kvs_handle *)0x0;
  do {
    pfVar7 = pfStack_bc0;
    fStack_900.kvs_config._4_1_ = 0;
    fStack_900.kvs_config.create_if_missing = true;
    fStack_900.kvs_config._1_3_ = 0x79656b;
    auStack_b00._0_8_ = 0x6363636363636363;
    auStack_b00._8_8_ = (fdb_custom_cmp_variable)0x6363636363636363;
    auStack_b00._16_8_ = (void *)0x6363636363636363;
    auStack_b00._24_8_ = (kvs_info *)0x6363636363636363;
    auStack_b00._32_8_ = (kvs_ops_stat *)0x6363636363636363;
    auStack_b00._40_7_ = 0x63636363636363;
    auStack_b00[0x2f] = 99;
    auStack_b00._48_7_ = 0x63636363636363;
    auStack_b00[0x37] = 99;
    auStack_b00._56_7_ = 0x63636363636363;
    auStack_b00[0x3f] = 99;
    auStack_b00._64_8_ = (btree *)0x6363636363636363;
    auStack_b00._72_8_ = (filemgr *)0x6363636363636363;
    auStack_b00._80_8_ = (docio_handle *)0x6363636363636363;
    auStack_b00._88_8_ = (btreeblk_handle *)0x6363636363636363;
    auStack_b00._96_8_ = (btree_blk_ops *)0x6363636363636363;
    auStack_b00._104_7_ = 0x63636363636363;
    auStack_b00[0x6f] = 99;
    auStack_b00._112_7_ = 0x63636363636363;
    auStack_b00._119_8_ = 0x6363636363636363;
    auStack_b00[0x7f] = 0;
    pcStack_bc8 = (code *)0x10d652;
    pfVar6 = (fdb_kvs_handle *)strlen(pcVar10);
    pcStack_bc8 = (code *)0x10d65d;
    sVar5 = strlen(pcVar17);
    pcStack_bc8 = (code *)0x10d671;
    fVar1 = fdb_set_kv(pfVar7,pcVar10,(size_t)pfVar6,pcVar17,sVar5);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010da16;
    pcStack_bc8 = (code *)0x10d688;
    fVar1 = fdb_get_file_info(pfStack_bb8,&fStack_b78);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010da0f;
    pfVar15 = (fdb_kvs_handle *)(ulong)((int)pfVar15 + 1);
  } while (fStack_b78.file_size < 0x1000000);
  pcStack_bc8 = (code *)0x10d6ab;
  sVar2 = sb_check_block_reusing(pfStack_bc0);
  if (sVar2 == SBD_RECLAIM) {
    pcStack_bc8 = (code *)0x10d6c3;
    fVar1 = fdb_commit(pfStack_bb8,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010da45;
    pcStack_bc8 = (code *)0x10d6dc;
    fVar1 = fdb_get_kvs_info(pfStack_bc0,&fStack_b30);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010da4c;
    pfStack_bb0 = (fdb_kvs_handle *)fStack_b30.last_seqnum;
    pfVar8 = &fStack_900;
    pfVar7 = (fdb_kvs_handle *)auStack_b00;
    pcVar17 = (char *)0x0;
    do {
      pcStack_bc8 = (code *)0x10d716;
      sprintf((char *)pfVar8,"%dkey",pcVar17);
      pfVar6 = pfStack_bc0;
      auStack_b00._0_8_ = 0x6464646464646464;
      auStack_b00._8_8_ = (fdb_custom_cmp_variable)0x6464646464646464;
      auStack_b00._16_8_ = (void *)0x6464646464646464;
      auStack_b00._24_8_ = (kvs_info *)0x6464646464646464;
      auStack_b00._32_8_ = (kvs_ops_stat *)0x6464646464646464;
      auStack_b00._40_7_ = 0x64646464646464;
      auStack_b00[0x2f] = 100;
      auStack_b00._48_7_ = 0x64646464646464;
      auStack_b00[0x37] = 100;
      auStack_b00._56_7_ = 0x64646464646464;
      auStack_b00[0x3f] = 0;
      pcStack_bc8 = (code *)0x10d751;
      pcVar10 = (char *)strlen((char *)pfVar8);
      pcStack_bc8 = (code *)0x10d75c;
      sVar5 = strlen((char *)pfVar7);
      pcStack_bc8 = (code *)0x10d770;
      fVar1 = fdb_set_kv(pfVar6,pfVar8,(size_t)pcVar10,pfVar7,sVar5);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010da24;
      pcStack_bc8 = (code *)0x10d787;
      fVar1 = fdb_commit(pfStack_bb8,'\x01');
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010da1d;
      uVar12 = (int)pcVar17 + 1;
      pcVar17 = (char *)(ulong)uVar12;
    } while (uVar12 != 10);
    pcStack_bc8 = (code *)0x10d7a3;
    fVar1 = fdb_kvs_close(pfStack_bc0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010da53;
    pcStack_bc8 = (code *)0x10d7b5;
    fVar1 = fdb_close(pfStack_bb8);
    pcVar10 = (char *)pfStack_bb0;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010da5a;
    pcStack_bc8 = (code *)0x10d7c7;
    fdb_shutdown();
    pcStack_bc8 = (code *)0x10d7e0;
    fVar1 = fdb_open(&pfStack_bb8,"./staleblktest1file.1",
                     (fdb_config *)&fStack_900.config.encryption_key);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010da61;
    pcStack_bc8 = (code *)0x10d801;
    fdb_kvs_open(pfStack_bb8,&pfStack_bc0,"./staleblktest1",&fStack_ba0);
    pcStack_bc8 = (code *)0x10d810;
    fVar1 = fdb_get_file_info(pfStack_bb8,&fStack_b78);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010da68;
    pcStack_bc8 = (code *)0x10d838;
    iVar3 = _disk_dump("./staleblktest1file.1",fStack_b78.file_size,
                       (ulong)(((uint)fStack_900.config.encryption_key.bytes._0_4_ >> 2) +
                              fStack_900.config.encryption_key.bytes._0_4_ * 2));
    if (iVar3 < 0) goto LAB_0010da6f;
    pcStack_bc8 = (code *)0x10d851;
    fVar1 = fdb_snapshot_open(pfStack_bc0,&pfStack_ba8,(fdb_seqnum_t)pcVar10);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010da74;
    pcStack_bc8 = (code *)0x10d864;
    fVar1 = fdb_rollback(&pfStack_bc0,(fdb_seqnum_t)pcVar10);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010da7b;
    pcStack_bc8 = (code *)0x10d87d;
    fVar1 = fdb_compact(pfStack_bb8,"./staleblktest1file.3");
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010da82;
    pcVar10 = "%dkey";
    pfVar7 = &fStack_900;
    pcVar17 = (char *)0x0;
    do {
      pcStack_bc8 = (code *)0x10d8a5;
      sprintf((char *)pfVar7,"%dkey",pcVar17);
      pfVar8 = pfStack_bc0;
      pcStack_bc8 = (code *)0x10d8b1;
      sVar5 = strlen((char *)pfVar7);
      pcStack_bc8 = (code *)0x10d8bf;
      fVar1 = fdb_del_kv(pfVar8,pfVar7,sVar5);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010da32;
      pcStack_bc8 = (code *)0x10d8d6;
      fVar1 = fdb_commit(pfStack_bb8,'\x01');
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010da2b;
      uVar12 = (int)pcVar17 + 1;
      pcVar17 = (char *)(ulong)uVar12;
    } while (uVar12 != 0xb);
    pcStack_bc8 = (code *)0x10d8ee;
    sVar2 = sb_check_block_reusing(pfStack_bc0);
    if (sVar2 != SBD_NONE) goto LAB_0010da89;
    pcVar17 = (char *)0x0;
    pcVar10 = auStack_b00;
    pfVar6 = &fStack_900;
    do {
      fStack_900.kvs_config._4_1_ = 0;
      fStack_900.kvs_config.create_if_missing = true;
      fStack_900.kvs_config._1_3_ = 0x79656b;
      pcStack_bc8 = (code *)0x10d92d;
      memset(pcVar10,0x65,0x1ff);
      pfVar8 = pfStack_bc0;
      auStack_b00[0x1ff] = 0;
      pcStack_bc8 = (code *)0x10d941;
      pfVar7 = (fdb_kvs_handle *)strlen((char *)pfVar6);
      pcStack_bc8 = (code *)0x10d94c;
      sVar5 = strlen(pcVar10);
      pcStack_bc8 = (code *)0x10d960;
      fVar1 = fdb_set_kv(pfVar8,pfVar6,(size_t)pfVar7,pcVar10,sVar5);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010da39;
      uVar12 = (int)pfVar15 - 1;
      pfVar15 = (fdb_kvs_handle *)(ulong)uVar12;
    } while (uVar12 != 0);
    pcStack_bc8 = (code *)0x10d976;
    sVar2 = sb_check_block_reusing(pfStack_bc0);
    if (sVar2 != SBD_RECLAIM) goto LAB_0010da8e;
    pcStack_bc8 = (code *)0x10d989;
    fVar1 = fdb_kvs_close(pfStack_ba8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010da93;
    pcStack_bc8 = (code *)0x10d99a;
    fVar1 = fdb_kvs_close(pfStack_bc0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010da9a;
    pcStack_bc8 = (code *)0x10d9ac;
    fVar1 = fdb_close(pfStack_bb8);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pcStack_bc8 = (code *)0x10d9b9;
      fdb_shutdown();
      pcStack_bc8 = (code *)0x10d9be;
      memleak_end();
      pcVar17 = "%s PASSED\n";
      if (crash_and_recover_with_num_keeping_test()::__test_pass != '\0') {
        pcVar17 = "%s FAILED\n";
      }
      pcStack_bc8 = (code *)0x10d9ef;
      fprintf(_stderr,pcVar17,"crash and recover with num keeping test");
      return;
    }
  }
  else {
LAB_0010da40:
    pcStack_bc8 = (code *)0x10da45;
    crash_and_recover_with_num_keeping_test();
LAB_0010da45:
    pcStack_bc8 = (code *)0x10da4c;
    crash_and_recover_with_num_keeping_test();
LAB_0010da4c:
    pcStack_bc8 = (code *)0x10da53;
    crash_and_recover_with_num_keeping_test();
LAB_0010da53:
    pcStack_bc8 = (code *)0x10da5a;
    crash_and_recover_with_num_keeping_test();
LAB_0010da5a:
    pcStack_bc8 = (code *)0x10da61;
    crash_and_recover_with_num_keeping_test();
LAB_0010da61:
    pcStack_bc8 = (code *)0x10da68;
    crash_and_recover_with_num_keeping_test();
LAB_0010da68:
    pcStack_bc8 = (code *)0x10da6f;
    crash_and_recover_with_num_keeping_test();
LAB_0010da6f:
    pcStack_bc8 = (code *)0x10da74;
    crash_and_recover_with_num_keeping_test();
LAB_0010da74:
    pcStack_bc8 = (code *)0x10da7b;
    crash_and_recover_with_num_keeping_test();
LAB_0010da7b:
    pcStack_bc8 = (code *)0x10da82;
    crash_and_recover_with_num_keeping_test();
LAB_0010da82:
    pcStack_bc8 = (code *)0x10da89;
    crash_and_recover_with_num_keeping_test();
LAB_0010da89:
    pcStack_bc8 = (code *)0x10da8e;
    crash_and_recover_with_num_keeping_test();
LAB_0010da8e:
    pcStack_bc8 = (code *)0x10da93;
    crash_and_recover_with_num_keeping_test();
LAB_0010da93:
    pcStack_bc8 = (code *)0x10da9a;
    crash_and_recover_with_num_keeping_test();
LAB_0010da9a:
    pcStack_bc8 = (code *)0x10daa1;
    crash_and_recover_with_num_keeping_test();
  }
  pcStack_bc8 = reuse_on_delete_test;
  crash_and_recover_with_num_keeping_test();
  pfStack_1070 = (fdb_kvs_handle *)0x10dac5;
  pfStack_bf0 = (fdb_kvs_handle *)pcVar10;
  pfStack_be8 = pfVar7;
  pfStack_be0 = pfVar6;
  pfStack_bd8 = pfVar15;
  pfStack_bd0 = pfVar8;
  pcStack_bc8 = (code *)pcVar17;
  gettimeofday(&tStack_1058,(__timezone_ptr_t)0x0);
  pfStack_1070 = (fdb_kvs_handle *)0x10daca;
  memleak_start();
  pfStack_1070 = (fdb_kvs_handle *)0x10dada;
  fdb_get_default_kvs_config();
  pfStack_1070 = (fdb_kvs_handle *)0x10daea;
  fdb_get_default_config();
  uStack_cb9 = 0;
  pfStack_c30 = (fdb_kvs_handle *)0x41;
  uStack_c18 = 10;
  pfStack_1070 = (fdb_kvs_handle *)0x10db11;
  system("rm -rf  staleblktest* > errorlog.txt");
  pfStack_1070 = (fdb_kvs_handle *)0x10db28;
  fdb_open(&pfStack_1060,"./staleblktest1",(fdb_config *)(auStack_e30 + 0x148));
  pfStack_1070 = (fdb_kvs_handle *)0x10db36;
  fdb_kvs_open_default(pfStack_1060,&pfStack_1068,(fdb_kvs_config *)(auStack_1048 + 0x200));
  pcVar11 = "%dkey";
  pcVar10 = auStack_e30 + 0x48;
  pcVar17 = auStack_1048;
  pfVar15 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1070 = (fdb_kvs_handle *)0x10db5b;
    sprintf(pcVar10,"%dkey",pfVar15);
    pfStack_1070 = (fdb_kvs_handle *)0x10db6d;
    memset(pcVar17,0x62,0x1ff);
    pfVar8 = pfStack_1068;
    auStack_1048[0x1ff] = 0;
    pfStack_1070 = (fdb_kvs_handle *)0x10db81;
    pfVar7 = (fdb_kvs_handle *)strlen(pcVar10);
    pfStack_1070 = (fdb_kvs_handle *)0x10db8c;
    sVar5 = strlen(pcVar17);
    pfStack_1070 = (fdb_kvs_handle *)0x10dba0;
    fVar1 = fdb_set_kv(pfVar8,pcVar10,(size_t)pfVar7,pcVar17,sVar5);
    if (fVar1 != FDB_RESULT_SUCCESS) {
LAB_0010de39:
      pfStack_1070 = (fdb_kvs_handle *)0x10de40;
      reuse_on_delete_test();
      goto LAB_0010de40;
    }
    pfStack_1070 = (fdb_kvs_handle *)0x10dbb7;
    fVar1 = fdb_commit(pfStack_1060,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pfStack_1070 = (fdb_kvs_handle *)0x10de39;
      reuse_on_delete_test();
      goto LAB_0010de39;
    }
    uVar12 = (int)pfVar15 + 1;
    pfVar15 = (fdb_kvs_handle *)(ulong)uVar12;
  } while (uVar12 != 0xb);
  pcVar17 = auStack_e30 + 0x48;
  pfVar8 = (fdb_kvs_handle *)auStack_1048;
  pfVar7 = (fdb_kvs_handle *)auStack_e30;
  pcVar11 = (char *)(fdb_kvs_handle *)0x0;
  do {
    pfVar6 = (fdb_kvs_handle *)pcVar11;
    pfStack_1070 = (fdb_kvs_handle *)0x10dbf0;
    sprintf(pcVar17,"%dkey",pfVar6);
    pfVar15 = pfStack_1068;
    auStack_1048._0_8_ = 0x6363636363636363;
    auStack_1048._8_8_ = (fdb_custom_cmp_variable)0x6363636363636363;
    auStack_1048._16_8_ = (void *)0x6363636363636363;
    auStack_1048._24_8_ = (kvs_info *)0x6363636363636363;
    auStack_1048._32_8_ = (kvs_ops_stat *)0x6363636363636363;
    auStack_1048._40_8_ = (fdb_file_handle *)0x6363636363636363;
    auStack_1048._48_8_ = (hbtrie *)0x6363636363636363;
    auStack_1048._56_8_ = (btree *)0x6363636363636363;
    auStack_1048._64_8_ = (btree *)0x6363636363636363;
    auStack_1048._72_8_ = (filemgr *)0x6363636363636363;
    auStack_1048._80_8_ = (docio_handle *)0x6363636363636363;
    auStack_1048._88_8_ = (btreeblk_handle *)0x6363636363636363;
    auStack_1048._96_8_ = (btree_blk_ops *)0x6363636363636363;
    auStack_1048._104_7_ = 0x63636363636363;
    auStack_1048[0x6f] = 99;
    auStack_1048._112_7_ = 0x63636363636363;
    auStack_1048._119_8_ = 0x6363636363636363;
    auStack_1048[0x7f] = 0;
    pfStack_1070 = (fdb_kvs_handle *)0x10dc39;
    pcVar10 = (char *)strlen(pcVar17);
    pfStack_1070 = (fdb_kvs_handle *)0x10dc44;
    sVar5 = strlen((char *)pfVar8);
    pfStack_1070 = (fdb_kvs_handle *)0x10dc58;
    fVar1 = fdb_set_kv(pfVar15,pcVar17,(size_t)pcVar10,pfVar8,sVar5);
    pcVar11 = (char *)pfVar6;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010de47;
    pfStack_1070 = (fdb_kvs_handle *)0x10dc6d;
    fVar1 = fdb_get_file_info(pfStack_1060,(fdb_file_info *)pfVar7);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010de40;
    uVar12 = (uint)pfVar6 + 1;
    pcVar11 = (char *)(ulong)uVar12;
  } while ((ulong)auStack_e30._40_8_ < (fdb_file_handle *)0x1000000);
  pfStack_1070 = (fdb_kvs_handle *)0x10dc92;
  sVar2 = sb_check_block_reusing(pfStack_1068);
  if (sVar2 == SBD_NONE) {
    pfStack_1070 = (fdb_kvs_handle *)0x10dca9;
    fVar1 = fdb_commit(pfStack_1060,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010de61;
    pcVar10 = "%dkey";
    pcVar17 = auStack_e30 + 0x48;
    pfVar15 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_1070 = (fdb_kvs_handle *)0x10dcd5;
      sprintf(pcVar17,"%dkey",pfVar15);
      pfVar8 = pfStack_1068;
      pfStack_1070 = (fdb_kvs_handle *)0x10dce1;
      sVar5 = strlen(pcVar17);
      pfStack_1070 = (fdb_kvs_handle *)0x10dcef;
      fVar1 = fdb_del_kv(pfVar8,pcVar17,sVar5);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010de4e;
      uVar13 = (int)pfVar15 + 1;
      pfVar15 = (fdb_kvs_handle *)(ulong)uVar13;
    } while (uVar12 != uVar13);
    pfStack_1070 = (fdb_kvs_handle *)0x10dd06;
    sVar2 = sb_check_block_reusing(pfStack_1068);
    if (sVar2 != SBD_RECLAIM) goto LAB_0010de68;
    if (2 < (uint)pfVar6) {
      pcVar11 = (char *)(ulong)(uVar12 >> 2);
      pcVar17 = auStack_e30 + 0x48;
      pfVar8 = (fdb_kvs_handle *)auStack_1048;
      pfVar15 = (fdb_kvs_handle *)0x0;
      do {
        pfStack_1070 = (fdb_kvs_handle *)0x10dd3e;
        sprintf(pcVar17,"%dkey",pfVar15);
        pfVar6 = pfStack_1068;
        auStack_1048._0_8_ = 0x6464646464646464;
        auStack_1048._8_8_ = (fdb_custom_cmp_variable)0x6464646464646464;
        auStack_1048._16_8_ = (void *)0x6464646464646464;
        auStack_1048._24_8_ = (kvs_info *)0x6464646464646464;
        auStack_1048._32_8_ = (kvs_ops_stat *)0x6464646464646464;
        auStack_1048._40_8_ = (fdb_file_handle *)0x6464646464646464;
        auStack_1048._48_8_ = (hbtrie *)0x6464646464646464;
        auStack_1048._56_8_ = (btree *)0x6464646464646464;
        auStack_1048._64_8_ = (btree *)0x6464646464646464;
        auStack_1048._72_8_ = (filemgr *)0x6464646464646464;
        auStack_1048._80_8_ = (docio_handle *)0x6464646464646464;
        auStack_1048._88_8_ = (btreeblk_handle *)0x6464646464646464;
        auStack_1048._96_8_ = (btree_blk_ops *)0x6464646464646464;
        auStack_1048._104_7_ = 0x64646464646464;
        auStack_1048[0x6f] = 100;
        auStack_1048._112_7_ = 0x64646464646464;
        auStack_1048._119_8_ = 0x6464646464646464;
        auStack_1048[0x7f] = 0;
        pfStack_1070 = (fdb_kvs_handle *)0x10dd87;
        pcVar10 = (char *)strlen(pcVar17);
        pfStack_1070 = (fdb_kvs_handle *)0x10dd92;
        sVar5 = strlen((char *)pfVar8);
        pfStack_1070 = (fdb_kvs_handle *)0x10dda6;
        fVar1 = fdb_set_kv(pfVar6,pcVar17,(size_t)pcVar10,pfVar8,sVar5);
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010de55;
        uVar13 = (int)pfVar15 + 2;
        pfVar15 = (fdb_kvs_handle *)(ulong)uVar13;
      } while (uVar13 < uVar12 >> 2);
    }
    pcVar17 = auStack_e30 + 0x48;
    pfStack_1070 = (fdb_kvs_handle *)0x10ddc2;
    sVar2 = sb_check_block_reusing(pfStack_1068);
    if (sVar2 != SBD_RECLAIM) goto LAB_0010de6d;
    pfStack_1070 = (fdb_kvs_handle *)0x10ddd5;
    fVar1 = fdb_close(pfStack_1060);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010de72;
    pfStack_1070 = (fdb_kvs_handle *)0x10dde2;
    fVar1 = fdb_shutdown();
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pfStack_1070 = (fdb_kvs_handle *)0x10ddef;
      memleak_end();
      pcVar17 = "%s PASSED\n";
      if (reuse_on_delete_test()::__test_pass != '\0') {
        pcVar17 = "%s FAILED\n";
      }
      pfStack_1070 = (fdb_kvs_handle *)0x10de20;
      fprintf(_stderr,pcVar17,"reuse on delete test");
      return;
    }
  }
  else {
LAB_0010de5c:
    pfStack_1070 = (fdb_kvs_handle *)0x10de61;
    reuse_on_delete_test();
LAB_0010de61:
    pfVar6 = pfVar7;
    pfStack_1070 = (fdb_kvs_handle *)0x10de68;
    reuse_on_delete_test();
LAB_0010de68:
    pfStack_1070 = (fdb_kvs_handle *)0x10de6d;
    reuse_on_delete_test();
LAB_0010de6d:
    pfStack_1070 = (fdb_kvs_handle *)0x10de72;
    reuse_on_delete_test();
LAB_0010de72:
    pfStack_1070 = (fdb_kvs_handle *)0x10de79;
    reuse_on_delete_test();
  }
  pfStack_1070 = (fdb_kvs_handle *)fragmented_reuse_test;
  reuse_on_delete_test();
  pfStack_1558 = (fdb_kvs_handle *)0x10de9d;
  fStack_1290.bub_ctx.space_used = (uint64_t)pcVar11;
  fStack_1290.bub_ctx.handle = pfVar8;
  pfStack_1088 = pfVar6;
  pcStack_1080 = pcVar10;
  pcStack_1078 = pcVar17;
  pfStack_1070 = pfVar15;
  gettimeofday(&tStack_1500,(__timezone_ptr_t)0x0);
  pfStack_1558 = (fdb_kvs_handle *)0x10dea2;
  memleak_start();
  pfStack_1558 = (fdb_kvs_handle *)0x10deaf;
  fdb_get_default_kvs_config();
  pfStack_1558 = (fdb_kvs_handle *)0x10debf;
  fdb_get_default_config();
  fStack_1290.config.block_reusing_threshold._7_1_ = 0;
  fStack_1290.max_seqnum = 0x23;
  fStack_1290.handle_busy.super___atomic_base<unsigned_char>._M_i =
       (__atomic_base<unsigned_char>)0xa;
  fStack_1290.dirty_updates = '\0';
  fStack_1290._466_6_ = 0;
  pfStack_1558 = (fdb_kvs_handle *)0x10dee6;
  system("rm -rf  staleblktest* > errorlog.txt");
  pfStack_1558 = (fdb_kvs_handle *)0x10defd;
  fdb_open(&pfStack_1540,"./staleblktest1",(fdb_config *)&fStack_1290.config.encryption_key);
  pfStack_1558 = (fdb_kvs_handle *)0x10df0d;
  fdb_kvs_open_default(pfStack_1540,&pfStack_1548,&fStack_14f0);
  pcVar11 = "%dkey";
  pcVar17 = (char *)&fStack_1290;
  pcVar10 = auStack_14d8 + 0x48;
  pfVar15 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1558 = (fdb_kvs_handle *)0x10df35;
    sprintf(pcVar17,"%dkey",pfVar15);
    pfStack_1558 = (fdb_kvs_handle *)0x10df47;
    memset(pcVar10,0x61,0x1ff);
    pfVar7 = pfStack_1548;
    uStack_1291 = 0;
    pfStack_1558 = (fdb_kvs_handle *)0x10df5c;
    pfVar8 = (fdb_kvs_handle *)strlen(pcVar17);
    pfStack_1558 = (fdb_kvs_handle *)0x10df67;
    sVar5 = strlen(pcVar10);
    pfStack_1558 = (fdb_kvs_handle *)0x10df7b;
    fVar1 = fdb_set_kv(pfVar7,pcVar17,(size_t)pfVar8,pcVar10,sVar5);
    if (fVar1 != FDB_RESULT_SUCCESS) {
LAB_0010e2e3:
      pfStack_1558 = (fdb_kvs_handle *)0x10e2ea;
      fragmented_reuse_test();
      goto LAB_0010e2ea;
    }
    pfStack_1558 = (fdb_kvs_handle *)0x10df92;
    fVar1 = fdb_commit(pfStack_1540,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pfStack_1558 = (fdb_kvs_handle *)0x10e2e3;
      fragmented_reuse_test();
      goto LAB_0010e2e3;
    }
    uVar12 = (int)pfVar15 + 1;
    pfVar15 = (fdb_kvs_handle *)(ulong)uVar12;
  } while (uVar12 != 0xb);
  pcVar10 = (char *)&fStack_1290;
  pfVar7 = (fdb_kvs_handle *)(auStack_14d8 + 0x48);
  pfVar8 = (fdb_kvs_handle *)auStack_14d8;
  pcVar11 = (char *)0x0;
  do {
    uVar12 = (uint)pcVar11;
    pfStack_1558 = (fdb_kvs_handle *)0x10dfcb;
    sprintf(pcVar10,"%dkey",pcVar11);
    pfVar15 = pfStack_1548;
    auStack_14d8._72_8_ = (filemgr *)0x6262626262626262;
    pdStack_1488 = (docio_handle *)0x6262626262626262;
    pbStack_1480 = (btreeblk_handle *)0x6262626262626262;
    pbStack_1478 = (btree_blk_ops *)0x6262626262626262;
    pfStack_1470 = (filemgr_ops *)0x6262626262626262;
    fStack_1468.chunksize = 0x6262;
    fStack_1468._2_2_ = 0x6262;
    fStack_1468.blocksize = 0x62626262;
    fStack_1468.buffercache_size = 0x6262626262626262;
    fStack_1468.wal_threshold = 0x6262626262626262;
    fStack_1468.wal_flush_before_commit = true;
    fStack_1468.auto_commit = true;
    fStack_1468._26_2_ = 0x6262;
    fStack_1468.purging_interval = 0x62626262;
    fStack_1468.seqtree_opt = 'b';
    fStack_1468.durability_opt = 'b';
    fStack_1468._34_2_ = 0x6262;
    fStack_1468.flags = 0x62626262;
    fStack_1468.compaction_buf_maxsize = 0x62626262;
    fStack_1468.cleanup_cache_onclose = true;
    fStack_1468.compress_document_body = true;
    fStack_1468.compaction_mode = 'b';
    fStack_1468.compaction_threshold = 'b';
    fStack_1468.compaction_minimum_filesize = 0x6262626262626262;
    fStack_1468.compactor_sleep_duration = 0x6262626262626262;
    fStack_1468.multi_kv_instances = true;
    fStack_1468._65_6_ = 0x626262626262;
    fStack_1468._71_1_ = 0x62;
    fStack_1468.prefetch_duration._0_7_ = 0x62626262626262;
    fStack_1468._79_8_ = 0x6262626262626262;
    fStack_1468._87_1_ = 0;
    pfStack_1558 = (fdb_kvs_handle *)0x10e027;
    pcVar17 = (char *)strlen(pcVar10);
    pfStack_1558 = (fdb_kvs_handle *)0x10e032;
    sVar5 = strlen((char *)pfVar7);
    pfStack_1558 = (fdb_kvs_handle *)0x10e046;
    fVar1 = fdb_set_kv(pfVar15,pcVar10,(size_t)pcVar17,pfVar7,sVar5);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e2f1;
    pfStack_1558 = (fdb_kvs_handle *)0x10e05b;
    fVar1 = fdb_get_file_info(pfStack_1540,(fdb_file_info *)pfVar8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e2ea;
    uVar13 = uVar12 + 1;
    pcVar11 = (char *)(ulong)uVar13;
  } while ((ulong)auStack_14d8._40_8_ < (fdb_file_handle *)0x1000000);
  uStack_1534 = uVar12;
  if (2 < uVar12) {
    uVar12 = (uVar13 >> 2) + (uint)(uVar13 >> 2 == 0);
    pfVar8 = (fdb_kvs_handle *)(ulong)uVar12;
    pcVar17 = "%dkey";
    pcVar10 = (char *)&fStack_1290;
    pfVar15 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_1558 = (fdb_kvs_handle *)0x10e0b2;
      sprintf(pcVar10,"%dkey",pfVar15);
      pfVar7 = pfStack_1548;
      pfStack_1558 = (fdb_kvs_handle *)0x10e0bf;
      sVar5 = strlen(pcVar10);
      pfStack_1558 = (fdb_kvs_handle *)0x10e0cd;
      fVar1 = fdb_del_kv(pfVar7,pcVar10,sVar5);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e2ff;
      uVar14 = (int)pfVar15 + 1;
      pfVar15 = (fdb_kvs_handle *)(ulong)uVar14;
    } while (uVar12 != uVar14);
  }
  pcVar10 = (char *)&fStack_1290;
  pfStack_1558 = (fdb_kvs_handle *)0x10e0e6;
  sVar2 = sb_check_block_reusing(pfStack_1548);
  if (sVar2 == SBD_NONE) {
    pcVar10 = (char *)(pfStack_1548->file->pos).super___atomic_base<unsigned_long>._M_i;
    pfStack_1558 = (fdb_kvs_handle *)0x10e10c;
    fVar1 = fdb_compact(pfStack_1540,"staleblktest_compact");
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e319;
    pfStack_1558 = (fdb_kvs_handle *)0x10e123;
    fVar1 = fdb_get_kvs_info(pfStack_1548,&fStack_1530);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e320;
    if (fStack_1530.doc_count == 0) {
      pfStack_1558 = (fdb_kvs_handle *)0x10e13d;
      fragmented_reuse_test();
    }
    pcVar17 = (char *)(ulong)(uVar13 >> 2);
    if (pcVar10 <=
        (fdb_kvs_handle *)(pfStack_1548->file->pos).super___atomic_base<unsigned_long>._M_i) {
      pfStack_1558 = (fdb_kvs_handle *)0x10e163;
      fragmented_reuse_test();
    }
    uVar12 = uVar13 >> 1;
    pfVar15 = (fdb_kvs_handle *)(ulong)uVar12;
    if (uVar13 >> 2 < uVar12) {
      pcVar10 = "%dkey";
      pfVar7 = &fStack_1290;
      do {
        pfStack_1558 = (fdb_kvs_handle *)0x10e18b;
        sprintf((char *)pfVar7,"%dkey",pcVar17);
        pfVar8 = pfStack_1548;
        pfStack_1558 = (fdb_kvs_handle *)0x10e198;
        sVar5 = strlen((char *)pfVar7);
        pfStack_1558 = (fdb_kvs_handle *)0x10e1a6;
        fVar1 = fdb_del_kv(pfVar8,pfVar7,sVar5);
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e306;
        uVar14 = (int)pcVar17 + 1;
        pcVar17 = (char *)(ulong)uVar14;
      } while (uVar14 < uVar12);
    }
    pfStack_1558 = (fdb_kvs_handle *)0x10e1c0;
    sVar2 = sb_check_block_reusing(pfStack_1548);
    if (sVar2 != SBD_NONE) goto LAB_0010e327;
    if (uVar12 <= uStack_1534) {
      pcVar17 = "%dkey";
      pcVar10 = (char *)&fStack_1290;
      do {
        pfStack_1558 = (fdb_kvs_handle *)0x10e1ec;
        sprintf(pcVar10,"%dkey",pfVar15);
        pfVar7 = pfStack_1548;
        pfStack_1558 = (fdb_kvs_handle *)0x10e1f9;
        sVar5 = strlen(pcVar10);
        pfStack_1558 = (fdb_kvs_handle *)0x10e207;
        fVar1 = fdb_del_kv(pfVar7,pcVar10,sVar5);
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e30d;
        uVar12 = (int)pfVar15 + 1;
        pfVar15 = (fdb_kvs_handle *)(ulong)uVar12;
      } while (uVar13 != uVar12);
    }
    pcVar11 = (char *)0xb;
    do {
      pfStack_1558 = (fdb_kvs_handle *)0x10e229;
      fVar1 = fdb_commit(pfStack_1540,'\x01');
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e2f8;
      uVar12 = (int)pcVar11 - 1;
      pcVar11 = (char *)(ulong)uVar12;
    } while (uVar12 != 0);
    pfStack_1558 = (fdb_kvs_handle *)0x10e244;
    fVar1 = fdb_get_kvs_info(pfStack_1548,&fStack_1530);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e32c;
    pfStack_1558 = (fdb_kvs_handle *)0x10e256;
    sVar2 = sb_check_block_reusing(pfStack_1548);
    if (sVar2 == SBD_NONE) goto LAB_0010e333;
    pfStack_1558 = (fdb_kvs_handle *)0x10e26d;
    fVar1 = fdb_commit(pfStack_1540,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e338;
    pfStack_1558 = (fdb_kvs_handle *)0x10e27f;
    fVar1 = fdb_close(pfStack_1540);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e33f;
    pfStack_1558 = (fdb_kvs_handle *)0x10e28c;
    fVar1 = fdb_shutdown();
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pfStack_1558 = (fdb_kvs_handle *)0x10e299;
      memleak_end();
      pcVar17 = "%s PASSED\n";
      if (fragmented_reuse_test()::__test_pass != '\0') {
        pcVar17 = "%s FAILED\n";
      }
      pfStack_1558 = (fdb_kvs_handle *)0x10e2ca;
      fprintf(_stderr,pcVar17,"fragmented reuse test");
      return;
    }
  }
  else {
LAB_0010e314:
    pfStack_1558 = (fdb_kvs_handle *)0x10e319;
    fragmented_reuse_test();
LAB_0010e319:
    pfStack_1558 = (fdb_kvs_handle *)0x10e320;
    fragmented_reuse_test();
LAB_0010e320:
    pfStack_1558 = (fdb_kvs_handle *)0x10e327;
    fragmented_reuse_test();
LAB_0010e327:
    pfStack_1558 = (fdb_kvs_handle *)0x10e32c;
    fragmented_reuse_test();
LAB_0010e32c:
    pfStack_1558 = (fdb_kvs_handle *)0x10e333;
    fragmented_reuse_test();
LAB_0010e333:
    pfStack_1558 = (fdb_kvs_handle *)0x10e338;
    fragmented_reuse_test();
LAB_0010e338:
    pfStack_1558 = (fdb_kvs_handle *)0x10e33f;
    fragmented_reuse_test();
LAB_0010e33f:
    pfStack_1558 = (fdb_kvs_handle *)0x10e346;
    fragmented_reuse_test();
  }
  pfStack_1558 = (fdb_kvs_handle *)enter_reuse_via_separate_kvs_test;
  fragmented_reuse_test();
  pcStackY_1a20 = (code *)0x10e36a;
  pcStack_1580 = pcVar11;
  pfStack_1578 = pfVar7;
  pfStack_1570 = pfVar8;
  pfStack_1568 = (fdb_kvs_handle *)pcVar17;
  pfStack_1560 = (fdb_kvs_handle *)pcVar10;
  pfStack_1558 = pfVar15;
  gettimeofday(&tStack_19e8,(__timezone_ptr_t)0x0);
  pcStackY_1a20 = (code *)0x10e36f;
  memleak_start();
  pfStack_19f8 = (fdb_doc *)0x0;
  pcStackY_1a20 = (code *)0x10e388;
  fdb_get_default_kvs_config();
  pcStackY_1a20 = (code *)0x10e398;
  fdb_get_default_config();
  fStack_1678.compaction_threshold = '\0';
  fStack_1678.block_reusing_threshold = 0x23;
  fStack_1678.num_keeping_headers = 10;
  pcStackY_1a20 = (code *)0x10e3bf;
  system("rm -rf  staleblktest* > errorlog.txt");
  pcStackY_1a20 = (code *)0x10e3d6;
  fdb_open(&pfStack_1a08,"./staleblktest1",&fStack_1678);
  pcStackY_1a20 = (code *)0x10e3ed;
  fdb_kvs_open(pfStack_1a08,&pfStack_1a10,"db",&fStack_17d8);
  pcStackY_1a20 = (code *)0x10e404;
  fdb_kvs_open(pfStack_1a08,&pfStack_19f0,"db2",&fStack_17d8);
  pcVar17 = acStack_1778;
  doc = (fdb_doc **)0x6161616161616161;
  pcVar10 = acStack_19d8;
  pcVar11 = (char *)0x0;
  do {
    pcStackY_1a20 = (code *)0x10e430;
    sprintf(pcVar17,"%dkey",pcVar11);
    pfVar15 = pfStack_1a10;
    builtin_strncpy(acStack_19d8,"aaaaaaaaaaa",0xc);
    pcStackY_1a20 = (code *)0x10e44f;
    sVar4 = strlen(pcVar17);
    pcStackY_1a20 = (code *)0x10e45a;
    sVar5 = strlen(pcVar10);
    pcStackY_1a20 = (code *)0x10e46e;
    fVar1 = fdb_set_kv(pfVar15,pcVar17,sVar4,pcVar10,sVar5);
    pfVar15 = pfStack_19f0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcStackY_1a20 = (code *)0x10e779;
      enter_reuse_via_separate_kvs_test();
LAB_0010e779:
      pcStackY_1a20 = (code *)0x10e780;
      enter_reuse_via_separate_kvs_test();
LAB_0010e780:
      pcStackY_1a20 = (code *)0x10e787;
      enter_reuse_via_separate_kvs_test();
      goto LAB_0010e787;
    }
    pcStackY_1a20 = (code *)0x10e483;
    sVar4 = strlen(pcVar17);
    pcStackY_1a20 = (code *)0x10e48e;
    sVar5 = strlen(pcVar10);
    pcStackY_1a20 = (code *)0x10e4a2;
    fVar1 = fdb_set_kv(pfVar15,pcVar17,sVar4,pcVar10,sVar5);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e779;
    pcStackY_1a20 = (code *)0x10e4b9;
    fVar1 = fdb_commit(pfStack_1a08,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e780;
    uVar12 = (int)pcVar11 + 1;
    pcVar11 = (char *)(ulong)uVar12;
  } while (uVar12 != 10);
  pcVar10 = (char *)0x0;
  pcVar11 = acStack_1778;
  pcVar17 = acStack_19d8;
  doc = (fdb_doc **)0x0;
  do {
    pfVar15 = pfStack_1a10;
    builtin_strncpy(acStack_1778,"0key",5);
    builtin_strncpy(acStack_19d8,
                    "bbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbb"
                    ,0x80);
    pcStackY_1a20 = (code *)0x10e541;
    sVar4 = strlen(pcVar11);
    pcStackY_1a20 = (code *)0x10e54c;
    sVar5 = strlen(pcVar17);
    pcStackY_1a20 = (code *)0x10e560;
    fVar1 = fdb_set_kv(pfVar15,pcVar11,sVar4,pcVar17,sVar5);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e78e;
    pcStackY_1a20 = (code *)0x10e57a;
    fVar1 = fdb_get_file_info(pfStack_1a08,&fStack_17c0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e787;
    uVar12 = (int)doc + 1;
    doc = (fdb_doc **)(ulong)uVar12;
  } while (fStack_17c0.file_size < 0x1000000);
  pcStackY_1a20 = (code *)0x10e5a0;
  sVar2 = sb_check_block_reusing(pfStack_1a10);
  if (sVar2 == SBD_RECLAIM) {
    pcStackY_1a20 = (code *)0x10e5b8;
    fVar1 = fdb_commit(pfStack_1a08,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e7a6;
    pcVar17 = acStack_1778;
    pcVar10 = acStack_19d8;
    pcVar11 = (char *)0x0;
    do {
      pcStackY_1a20 = (code *)0x10e5e2;
      sprintf(pcVar17,"key%d",pcVar11);
      pfVar15 = pfStack_1a10;
      builtin_strncpy(acStack_19d8,
                      "ccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccc"
                      ,0x80);
      pcStackY_1a20 = (code *)0x10e632;
      sVar4 = strlen(pcVar17);
      pcStackY_1a20 = (code *)0x10e63d;
      sVar5 = strlen(pcVar10);
      pcStackY_1a20 = (code *)0x10e651;
      fVar1 = fdb_set_kv(pfVar15,pcVar17,sVar4,pcVar10,sVar5);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e795;
      uVar13 = (int)pcVar11 + 1;
      pcVar11 = (char *)(ulong)uVar13;
    } while (uVar12 != uVar13);
    pcStackY_1a20 = (code *)0x10e672;
    fVar1 = fdb_commit(pfStack_1a08,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e7ad;
    pcStackY_1a20 = (code *)0x10e69a;
    fdb_iterator_init(pfStack_19f0,&pfStack_1a00,(void *)0x0,0,(void *)0x0,0,0);
    pcVar11 = (char *)0xa;
    doc = &pfStack_19f8;
    do {
      pcStackY_1a20 = (code *)0x10e6b1;
      fVar1 = fdb_iterator_get(pfStack_1a00,doc);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e79c;
      pcStackY_1a20 = (code *)0x10e6c3;
      fdb_doc_free(pfStack_19f8);
      pfStack_19f8 = (fdb_doc *)0x0;
      pcStackY_1a20 = (code *)0x10e6d6;
      fVar1 = fdb_iterator_next(pfStack_1a00);
      uVar12 = (int)pcVar11 - 1;
      pcVar11 = (char *)(ulong)uVar12;
    } while (fVar1 != FDB_RESULT_ITERATOR_FAIL);
    if (uVar12 != 0) goto LAB_0010e7b4;
    pcStackY_1a20 = (code *)0x10e6ef;
    fdb_iterator_close(pfStack_1a00);
    pcStackY_1a20 = (code *)0x10e6f9;
    fVar1 = fdb_kvs_close(pfStack_1a10);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0010e7b9;
    pcStackY_1a20 = (code *)0x10e70b;
    fVar1 = fdb_kvs_close(pfStack_19f0);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pcStackY_1a20 = (code *)0x10e71d;
      fVar1 = fdb_close(pfStack_1a08);
      if (fVar1 == FDB_RESULT_SUCCESS) {
        pcStackY_1a20 = (code *)0x10e72a;
        fdb_shutdown();
        pcStackY_1a20 = (code *)0x10e72f;
        memleak_end();
        pcVar17 = "%s PASSED\n";
        if (enter_reuse_via_separate_kvs_test()::__test_pass != '\0') {
          pcVar17 = "%s FAILED\n";
        }
        pcStackY_1a20 = (code *)0x10e760;
        fprintf(_stderr,pcVar17,"enter reuse via separate kvs test");
        return;
      }
      goto LAB_0010e7c7;
    }
  }
  else {
LAB_0010e7a1:
    pcStackY_1a20 = (code *)0x10e7a6;
    enter_reuse_via_separate_kvs_test();
LAB_0010e7a6:
    pcStackY_1a20 = (code *)0x10e7ad;
    enter_reuse_via_separate_kvs_test();
LAB_0010e7ad:
    pcStackY_1a20 = (code *)0x10e7b4;
    enter_reuse_via_separate_kvs_test();
LAB_0010e7b4:
    pcStackY_1a20 = (code *)0x10e7b9;
    enter_reuse_via_separate_kvs_test();
LAB_0010e7b9:
    pcStackY_1a20 = (code *)0x10e7c0;
    enter_reuse_via_separate_kvs_test();
  }
  pcStackY_1a20 = (code *)0x10e7c7;
  enter_reuse_via_separate_kvs_test();
LAB_0010e7c7:
  pcStackY_1a20 = child_function;
  enter_reuse_via_separate_kvs_test();
  ppfStackY_1a48 = doc;
  sStackY_1a38 = sVar4;
  pcStackY_1a30 = pcVar17;
  pcStackY_1a28 = pcVar10;
  pcStackY_1a20 = (code *)pcVar11;
  fdb_get_default_kvs_config();
  fdb_get_default_config();
  fStackY_1d48.block_reusing_threshold = 0x41;
  fStackY_1d48.num_keeping_headers = 5;
  fdb_open(&pfStackY_1e70,"./staleblktest1",&fStackY_1d48);
  fdb_kvs_open(pfStackY_1e70,&pfStackY_1e78,"db",&fStackY_1e68);
  iVar3 = 0;
  uVar16 = 0;
  do {
    sprintf(acStackY_1e50,"key%d",uVar16);
    sprintf(acStackY_1c50,"seqno%d",uVar16);
    pfVar15 = pfStackY_1e78;
    sVar5 = strlen(acStackY_1e50);
    sVar4 = strlen(acStackY_1c50);
    fdb_set_kv(pfVar15,acStackY_1e50,sVar5,acStackY_1c50,sVar4);
    if ((int)(uVar16 / 100) * 100 + iVar3 == 0) {
      fdb_commit(pfStackY_1e70,(int)(uVar16 / 500) * 500 + iVar3 == 0);
    }
    uVar16 = (ulong)((int)uVar16 + 1);
    iVar3 = iVar3 + -1;
  } while( true );
LAB_0010da0f:
  pcStack_bc8 = (code *)0x10da16;
  crash_and_recover_with_num_keeping_test();
LAB_0010da16:
  pcStack_bc8 = (code *)0x10da1d;
  crash_and_recover_with_num_keeping_test();
LAB_0010da1d:
  pcStack_bc8 = (code *)0x10da24;
  crash_and_recover_with_num_keeping_test();
LAB_0010da24:
  pcStack_bc8 = (code *)0x10da2b;
  crash_and_recover_with_num_keeping_test();
LAB_0010da2b:
  pcStack_bc8 = (code *)0x10da32;
  crash_and_recover_with_num_keeping_test();
LAB_0010da32:
  pcStack_bc8 = (code *)0x10da39;
  crash_and_recover_with_num_keeping_test();
LAB_0010da39:
  pcStack_bc8 = (code *)0x10da40;
  crash_and_recover_with_num_keeping_test();
  goto LAB_0010da40;
LAB_0010de40:
  pfStack_1070 = (fdb_kvs_handle *)0x10de47;
  reuse_on_delete_test();
LAB_0010de47:
  pfVar6 = pfVar7;
  pfStack_1070 = (fdb_kvs_handle *)0x10de4e;
  reuse_on_delete_test();
LAB_0010de4e:
  pfStack_1070 = (fdb_kvs_handle *)0x10de55;
  reuse_on_delete_test();
LAB_0010de55:
  pfStack_1070 = (fdb_kvs_handle *)0x10de5c;
  reuse_on_delete_test();
  pfVar7 = pfVar6;
  goto LAB_0010de5c;
LAB_0010e2ea:
  pfStack_1558 = (fdb_kvs_handle *)0x10e2f1;
  fragmented_reuse_test();
LAB_0010e2f1:
  pfStack_1558 = (fdb_kvs_handle *)0x10e2f8;
  fragmented_reuse_test();
LAB_0010e2f8:
  pfStack_1558 = (fdb_kvs_handle *)0x10e2ff;
  fragmented_reuse_test();
LAB_0010e2ff:
  pfStack_1558 = (fdb_kvs_handle *)0x10e306;
  fragmented_reuse_test();
LAB_0010e306:
  pfStack_1558 = (fdb_kvs_handle *)0x10e30d;
  fragmented_reuse_test();
LAB_0010e30d:
  pfStack_1558 = (fdb_kvs_handle *)0x10e314;
  fragmented_reuse_test();
  goto LAB_0010e314;
LAB_0010e787:
  pcStackY_1a20 = (code *)0x10e78e;
  enter_reuse_via_separate_kvs_test();
LAB_0010e78e:
  pcStackY_1a20 = (code *)0x10e795;
  enter_reuse_via_separate_kvs_test();
LAB_0010e795:
  pcStackY_1a20 = (code *)0x10e79c;
  enter_reuse_via_separate_kvs_test();
LAB_0010e79c:
  pcStackY_1a20 = (code *)0x10e7a1;
  enter_reuse_via_separate_kvs_test();
  goto LAB_0010e7a1;
}

Assistant:

void rollback_with_num_keeping_headers() {
    TEST_INIT();
    memleak_start();

    int i, n, r;
    char keybuf[256];
    char bodybuf[1024];
    fdb_status status;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_kvs_info kvs_info;
    sb_decision_t sb_decision;
    fdb_file_info file_info;

    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_config fconfig = fdb_get_default_config();
    fconfig.compaction_threshold = 0;
    fconfig.block_reusing_threshold = 65;
    fconfig.num_keeping_headers = 1;

    // remove previous staleblktest files
    r = system(SHELL_DEL" staleblktest* > errorlog.txt");
    (void)r;

    fdb_open(&dbfile, "./staleblktest1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);

    // create 10 headers
    for (i = 0; i < 10; i++) {
        sprintf(keybuf, "%dkey",i);
        fillstr(bodybuf, 'b', 512);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            bodybuf, strlen(bodybuf));
        TEST_STATUS(status);
        status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_STATUS(status);
    }

    // load until exceeding SB_MIN_BLOCK_REUSING_FILESIZE
    i = 0;
    do {
        sprintf(keybuf, "0key");
        fillstr(bodybuf, 'c', 128);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            bodybuf, strlen(bodybuf));
        TEST_STATUS(status);
        i++;
        status = fdb_get_file_info(dbfile, &file_info);
        TEST_STATUS(status);
    } while (file_info.file_size < SB_MIN_BLOCK_REUSING_FILESIZE);
    n = i;

    // expect block reclaim
    sb_decision = sb_check_block_reusing(db);
    TEST_CHK(sb_decision == SBD_RECLAIM);

    // reclaim old header via 11th commit
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);

    // load unique keys to reuse old blocks
    for (i = 0; i < n; i++) {
        sprintf(keybuf, "%dkey",i);
        fillstr(bodybuf, 'd', 512);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            bodybuf, strlen(bodybuf));
        TEST_STATUS(status);
    }

    // do rollback to 10th headers
    status = fdb_rollback(&db, 10);
    TEST_STATUS(status);

    // expect only 10 docs
    status = fdb_get_kvs_info(db, &kvs_info);
    TEST_STATUS(status);
    TEST_CHK(kvs_info.doc_count == 10);

    // cleanup
    status = fdb_kvs_close(db);
    TEST_STATUS(status);
    status = fdb_close(dbfile);
    TEST_STATUS(status);
    fdb_shutdown();

    memleak_end();
    TEST_RESULT("rollback with num keeping headers");
}